

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

TreeOrError *
slang::syntax::SyntaxTree::fromFiles
          (TreeOrError *__return_storage_ptr__,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          paths)

{
  Bag *in_R9;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> paths_00
  ;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  paths_00._M_ptr = paths._M_extent._M_extent_value;
  getDefaultSourceManager();
  local_48 = 0x3f;
  local_40 = 1;
  local_30 = 0;
  local_38 = &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  local_28 = 0;
  uStack_20 = 0;
  paths_00._M_extent._M_extent_value = (size_t)&getDefaultSourceManager::instance;
  fromFiles(__return_storage_ptr__,(SyntaxTree *)paths._M_ptr,paths_00,
            (SourceManager *)&stack0xffffffffffffffb8,in_R9);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&stack0xffffffffffffffb8);
  return __return_storage_ptr__;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths) {
    return fromFiles(paths, getDefaultSourceManager());
}